

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall
Snake::UpdateBody(Snake *this,SDL_Point *current_head_cell,SDL_Point *prev_head_cell)

{
  bool bVar1;
  reference pSVar2;
  SDL_Point *item;
  iterator __end1;
  iterator __begin1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1;
  __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_> local_30;
  const_iterator local_28;
  SDL_Point *local_20;
  SDL_Point *prev_head_cell_local;
  SDL_Point *current_head_cell_local;
  Snake *this_local;
  
  local_20 = prev_head_cell;
  prev_head_cell_local = current_head_cell;
  current_head_cell_local = (SDL_Point *)this;
  std::vector<SDL_Point,_std::allocator<SDL_Point>_>::push_back(&this->body,prev_head_cell);
  if ((this->growing & 1U) == 0) {
    local_30._M_current =
         (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&this->body);
    __gnu_cxx::__normal_iterator<SDL_Point_const*,std::vector<SDL_Point,std::allocator<SDL_Point>>>
    ::__normal_iterator<SDL_Point*>
              ((__normal_iterator<SDL_Point_const*,std::vector<SDL_Point,std::allocator<SDL_Point>>>
                *)&local_28,&local_30);
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::erase(&this->body,local_28);
  }
  else {
    this->growing = false;
    this->size = this->size + 1;
  }
  __end1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&this->body);
  item = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&this->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                                *)&item);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
             operator*(&__end1);
    if ((prev_head_cell_local->x == pSVar2->x) && (prev_head_cell_local->y == pSVar2->y)) {
      this->alive = false;
    }
    __gnu_cxx::__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Snake::UpdateBody(SDL_Point &current_head_cell, SDL_Point &prev_head_cell) {
  // Add previous head location to vector
  body.push_back(prev_head_cell);

  if (!growing) {
    // Remove the tail from the vector.
    body.erase(body.begin());
  } else {
    growing = false;
    size++;
  }

  // Check if the snake has died.
  for (auto const &item : body) {
    if (current_head_cell.x == item.x && current_head_cell.y == item.y) {
      alive = false;
    }
  }
}